

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_value_scanner.cpp
# Opt level: O0

void __thiscall duckdb::StringValueScanner::Flush(StringValueScanner *this,DataChunk *insert_chunk)

{
  long lVar1;
  ulong uVar2;
  DataChunk *pDVar3;
  bool bVar4;
  LogicalTypeId LVar5;
  idx_t iVar6;
  CSVFileScan *pCVar7;
  DataChunk *pDVar8;
  reference pvVar9;
  undefined8 uVar10;
  CSVStateMachine *pCVar11;
  bool *pbVar12;
  idx_t iVar13;
  ostream *poVar14;
  mapped_type *pmVar15;
  mapped_type *pmVar16;
  LogicalType *this_00;
  CSVBufferHandle *pCVar17;
  DataChunk *in_RSI;
  long *in_RDI;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar18;
  idx_t to_pos;
  idx_t row_idx;
  idx_t sel_idx;
  SelectionVector successful_rows;
  CSVError csv_error_1;
  string error_msg_1;
  ostringstream error_1;
  string borked_line_1;
  bool first_nl_1;
  LinesPerBoundary lines_per_batch_1;
  idx_t col_1;
  vector<duckdb::Value,_true> row_1;
  CSVError csv_error;
  idx_t row_byte_pos;
  string error_msg;
  ostringstream error;
  string borked_line;
  bool first_nl;
  LinesPerBoundary lines_per_batch;
  idx_t col;
  vector<duckdb::Value,_true> row;
  UnifiedVectorFormat parse_column_data;
  UnifiedVectorFormat inserted_column_data;
  idx_t line_error;
  string error_message;
  LogicalType *parse_type;
  LogicalType *type;
  value_type *result_vector;
  value_type *parse_vector;
  idx_t result_idx;
  idx_t i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *names;
  DataChunk *parse_chunk;
  StringValueResult *process_result;
  bool continue_processing;
  DataChunk *in_stack_fffffffffffff448;
  undefined4 uVar19;
  CSVReaderOptions *in_stack_fffffffffffff450;
  Vector *in_stack_fffffffffffff458;
  StringValueResult *in_stack_fffffffffffff460;
  uint in_stack_fffffffffffff468;
  undefined4 in_stack_fffffffffffff46c;
  LogicalType *in_stack_fffffffffffff470;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffff480;
  StringValueResult *in_stack_fffffffffffff488;
  StringValueResult *in_stack_fffffffffffff490;
  CSVErrorHandler *in_stack_fffffffffffff498;
  undefined7 in_stack_fffffffffffff4a0;
  LogicalTypeId in_stack_fffffffffffff4a7;
  Vector *in_stack_fffffffffffff4a8;
  optional_idx in_stack_fffffffffffff4b0;
  Vector *in_stack_fffffffffffff4b8;
  DataChunk *in_stack_fffffffffffff4c0;
  undefined7 in_stack_fffffffffffff4f0;
  LogicalTypeId in_stack_fffffffffffff4f7;
  Vector *in_stack_fffffffffffff4f8;
  Vector *in_stack_fffffffffffff500;
  UnifiedVectorFormat *in_stack_fffffffffffff510;
  undefined7 in_stack_fffffffffffff518;
  undefined1 in_stack_fffffffffffff51f;
  Vector *in_stack_fffffffffffff520;
  idx_t in_stack_fffffffffffff580;
  undefined1 uVar20;
  undefined7 in_stack_fffffffffffff588;
  undefined1 in_stack_fffffffffffff58f;
  _Node_iterator_base<unsigned_long,_false> in_stack_fffffffffffff590;
  CSVErrorHandler *in_stack_fffffffffffff598;
  bool local_8f2;
  bool local_8e1;
  bool local_8c9;
  ulong local_8a0;
  _Node_iterator_base<unsigned_long,_false> local_898;
  _Node_iterator_base<unsigned_long,_false> local_890;
  StringValueResult *local_888;
  long local_880;
  StringValueResult *local_860;
  DataChunk *local_858;
  CSVReaderOptions *pCStack_850;
  string local_7b8 [32];
  string local_798 [96];
  ostringstream local_738 [8];
  string *in_stack_fffffffffffff8d0;
  idx_t in_stack_fffffffffffff8d8;
  string *in_stack_fffffffffffff8e0;
  string *in_stack_fffffffffffff8e8;
  CSVReaderOptions *in_stack_fffffffffffff8f0;
  optional_idx in_stack_fffffffffffff8f8;
  LinesPerBoundary in_stack_fffffffffffff910;
  idx_t in_stack_fffffffffffff920;
  LogicalTypeId in_stack_fffffffffffff930;
  string *in_stack_fffffffffffff938;
  string local_5c0 [24];
  LogicalType *in_stack_fffffffffffffa58;
  LinesPerBoundary local_598 [5];
  ulong local_548;
  _Node_iterator_base<unsigned_long,_false> local_528;
  undefined1 local_520;
  _Node_iterator_base<unsigned_long,_false> local_518;
  undefined1 local_510;
  ulong local_508;
  StringValueResult *local_500;
  DataChunk *local_4f8;
  CSVReaderOptions *pCStack_4f0;
  Vector *local_450;
  string local_448 [32];
  string local_428 [96];
  ostringstream local_3c8 [376];
  string local_250 [39];
  byte local_229;
  LinesPerBoundary local_228 [5];
  ulong local_1d8;
  undefined4 local_124;
  ulong local_120;
  string local_118 [39];
  byte local_f1;
  byte local_d1;
  byte local_b1;
  LogicalType *local_98;
  LogicalType *local_90;
  reference local_88;
  reference local_80;
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  DataChunk *local_40;
  DataChunk *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *local_30;
  DataChunk *local_28;
  undefined8 local_20;
  byte local_11;
  DataChunk *local_10;
  
  local_10 = in_RSI;
  do {
    local_11 = 0;
    local_20 = (**(code **)(*in_RDI + 0x10))();
    local_28 = StringValueResult::ToChunk(in_stack_fffffffffffff490);
    DataChunk::Reset((DataChunk *)in_stack_fffffffffffff4b0.index);
    shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
              ((shared_ptr<duckdb::CSVErrorHandler,_true> *)in_stack_fffffffffffff450);
    CSVErrorHandler::ErrorIfNeeded((CSVErrorHandler *)in_stack_fffffffffffff480._M_cur);
    iVar6 = DataChunk::size(local_28);
    if (iVar6 == 0) {
      return;
    }
    DataChunk::SetCardinality((DataChunk *)in_stack_fffffffffffff450,in_stack_fffffffffffff448);
    pCVar7 = shared_ptr<duckdb::CSVFileScan,_true>::operator->
                       ((shared_ptr<duckdb::CSVFileScan,_true> *)in_stack_fffffffffffff450);
    local_30 = CSVFileScan::GetNames_abi_cxx11_(pCVar7);
    local_38 = (DataChunk *)0x0;
    while( true ) {
      pDVar3 = local_38;
      shared_ptr<duckdb::CSVFileScan,_true>::operator->
                ((shared_ptr<duckdb::CSVFileScan,_true> *)in_stack_fffffffffffff450);
      pDVar8 = (DataChunk *)
               MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId>::size
                         ((MultiFileLocalColumnIds<duckdb::MultiFileLocalColumnId> *)0x1ae2b17);
      if (pDVar8 <= pDVar3) break;
      local_40 = local_38;
      shared_ptr<duckdb::CSVFileScan,_true>::operator->
                ((shared_ptr<duckdb::CSVFileScan,_true> *)in_stack_fffffffffffff450);
      bVar4 = ::std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::empty((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       *)in_stack_fffffffffffff460);
      if (!bVar4) {
        pCVar7 = shared_ptr<duckdb::CSVFileScan,_true>::operator->
                           ((shared_ptr<duckdb::CSVFileScan,_true> *)in_stack_fffffffffffff450);
        pvVar9 = ::std::
                 vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                 ::operator[](&pCVar7->projection_ids,(size_type)local_38);
        local_40 = (DataChunk *)pvVar9->second;
      }
      pDVar3 = local_38;
      pDVar8 = (DataChunk *)DataChunk::ColumnCount((DataChunk *)0x1ae2bb0);
      if (pDVar8 <= pDVar3) {
        local_75 = 1;
        uVar10 = __cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_60,"Mismatch between the schema of different files",&local_61);
        InvalidInputException::InvalidInputException
                  ((InvalidInputException *)in_stack_fffffffffffff450,
                   (string *)in_stack_fffffffffffff448);
        local_75 = 0;
        __cxa_throw(uVar10,&InvalidInputException::typeinfo,
                    InvalidInputException::~InvalidInputException);
      }
      local_80 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff450,
                            (size_type)in_stack_fffffffffffff448);
      local_88 = vector<duckdb::Vector,_true>::operator[]
                           ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff450,
                            (size_type)in_stack_fffffffffffff448);
      local_90 = Vector::GetType(local_88);
      local_98 = Vector::GetType(local_80);
      bVar4 = LogicalType::IsJSONType((LogicalType *)in_stack_fffffffffffff498);
      local_b1 = 0;
      local_d1 = 0;
      local_f1 = 0;
      local_8c9 = false;
      if (!bVar4) {
        LogicalType::LogicalType
                  (in_stack_fffffffffffff470,
                   (LogicalTypeId)((uint)in_stack_fffffffffffff46c >> 0x18));
        local_b1 = 1;
        bVar4 = LogicalType::operator==
                          ((LogicalType *)in_stack_fffffffffffff458,
                           (LogicalType *)in_stack_fffffffffffff450);
        local_8e1 = true;
        if (!bVar4) {
          LogicalType::LogicalType
                    (in_stack_fffffffffffff470,
                     (LogicalTypeId)((uint)in_stack_fffffffffffff46c >> 0x18));
          local_d1 = 1;
          bVar4 = LogicalType::operator!=
                            ((LogicalType *)in_stack_fffffffffffff450,
                             (LogicalType *)in_stack_fffffffffffff448);
          local_8f2 = false;
          if (bVar4) {
            LogicalType::LogicalType
                      (in_stack_fffffffffffff470,
                       (LogicalTypeId)((uint)in_stack_fffffffffffff46c >> 0x18));
            local_f1 = 1;
            local_8f2 = LogicalType::operator!=
                                  ((LogicalType *)in_stack_fffffffffffff450,
                                   (LogicalType *)in_stack_fffffffffffff448);
          }
          local_8e1 = local_8f2;
        }
        local_8c9 = local_8e1;
      }
      if ((local_f1 & 1) != 0) {
        LogicalType::~LogicalType((LogicalType *)0x1ae2eb8);
      }
      if ((local_d1 & 1) != 0) {
        LogicalType::~LogicalType((LogicalType *)0x1ae2ed1);
      }
      if ((local_b1 & 1) != 0) {
        LogicalType::~LogicalType((LogicalType *)0x1ae2eea);
      }
      if (local_8c9 == false) {
        ::std::__cxx11::string::string(local_118);
        uVar19 = (undefined4)((ulong)in_stack_fffffffffffff448 >> 0x20);
        local_120 = 0;
        shared_ptr<duckdb::CSVBufferManager,_true>::operator->
                  ((shared_ptr<duckdb::CSVBufferManager,_true> *)in_stack_fffffffffffff450);
        DataChunk::size(local_28);
        in_stack_fffffffffffff448 = (DataChunk *)CONCAT44(uVar19,1);
        bVar4 = VectorOperations::TryCast
                          ((ClientContext *)in_stack_fffffffffffff4b0.index,
                           in_stack_fffffffffffff4a8,
                           (Vector *)CONCAT17(in_stack_fffffffffffff4a7,in_stack_fffffffffffff4a0),
                           (idx_t)in_stack_fffffffffffff498,(string *)in_stack_fffffffffffff490,
                           SUB81((ulong)in_stack_fffffffffffff488 >> 0x38,0),
                           SUB81((ulong)in_stack_fffffffffffff488 >> 0x30,0));
        if (bVar4) {
          local_124 = 6;
        }
        else {
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffff460)
          ;
          DataChunk::size(local_28);
          Vector::ToUnifiedFormat
                    (in_stack_fffffffffffff520,
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffff460)
          ;
          DataChunk::size(local_28);
          Vector::ToUnifiedFormat
                    (in_stack_fffffffffffff520,
                     CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                     in_stack_fffffffffffff510);
          while ((uVar2 = local_120, iVar6 = DataChunk::size(local_28), uVar2 < iVar6 &&
                 ((bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                     ((TemplatedValidityMask<unsigned_long> *)
                                      in_stack_fffffffffffff458,(idx_t)in_stack_fffffffffffff450),
                  bVar4 || (bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                              ((TemplatedValidityMask<unsigned_long> *)
                                               in_stack_fffffffffffff458,
                                               (idx_t)in_stack_fffffffffffff450), !bVar4))))) {
            local_120 = local_120 + 1;
          }
          pCVar11 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                              ((shared_ptr<duckdb::CSVStateMachine,_true> *)
                               in_stack_fffffffffffff450);
          pbVar12 = CSVOption<bool>::GetValue(&pCVar11->options->ignore_errors);
          uVar20 = (undefined1)(in_stack_fffffffffffff580 >> 0x38);
          if ((*pbVar12 & 1U) != 0) {
            vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1ae328b);
            local_1d8 = 0;
            while( true ) {
              uVar2 = local_1d8;
              iVar6 = DataChunk::ColumnCount((DataChunk *)0x1ae32b4);
              uVar20 = (undefined1)(in_stack_fffffffffffff580 >> 0x38);
              if (iVar6 <= uVar2) break;
              DataChunk::GetValue((DataChunk *)
                                  CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                  (idx_t)in_stack_fffffffffffff460,(idx_t)in_stack_fffffffffffff458)
              ;
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                         in_stack_fffffffffffff450,(value_type *)in_stack_fffffffffffff448);
              Value::~Value((Value *)in_stack_fffffffffffff450);
              local_1d8 = local_1d8 + 1;
            }
            vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1ae3381);
          }
          shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                    ((shared_ptr<duckdb::CSVStateMachine,_true> *)in_stack_fffffffffffff450);
          bVar4 = CSVReaderOptions::IgnoreErrors(in_stack_fffffffffffff450);
          if (!bVar4) {
            iVar6 = CSVIterator::GetBoundaryIdx((CSVIterator *)(in_RDI + 0xb));
            lVar1 = in_RDI[0x18];
            iVar13 = DataChunk::size(local_28);
            LinesPerBoundary::LinesPerBoundary(local_228,iVar6,(lVar1 - iVar13) + local_120);
            local_229 = 0;
            ::std::
            unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
            ::operator[]((unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                          *)in_stack_fffffffffffff450,(key_type *)in_stack_fffffffffffff448);
            StringValueResult::PrintErrorLine(in_stack_fffffffffffff460);
            FullLinePosition::
            ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                      ((FullLinePosition *)in_stack_fffffffffffff598,
                       (bool *)in_stack_fffffffffffff590._M_cur,
                       (unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),(bool)uVar20
                      );
            ::std::__cxx11::ostringstream::ostringstream(local_3c8);
            ::std::operator<<((ostream *)local_3c8,"Could not convert string \"");
            Vector::GetValue(in_stack_fffffffffffff458,(idx_t)in_stack_fffffffffffff450);
            poVar14 = duckdb::operator<<((ostream *)in_stack_fffffffffffff490,
                                         (Value *)in_stack_fffffffffffff488);
            poVar14 = ::std::operator<<(poVar14,"\" to \'");
            LogicalType::ToString_abi_cxx11_(in_stack_fffffffffffffa58);
            poVar14 = ::std::operator<<(poVar14,local_428);
            ::std::operator<<(poVar14,"\'");
            ::std::__cxx11::string::~string(local_428);
            Value::~Value((Value *)in_stack_fffffffffffff450);
            ::std::__cxx11::ostringstream::str();
            FullLinePosition::SanitizeError
                      ((string *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0));
            local_450 = (Vector *)0x0;
            pmVar15 = ::std::
                      unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                      ::operator[]((unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                                    *)in_stack_fffffffffffff450,
                                   (key_type *)in_stack_fffffffffffff448);
            pmVar16 = ::std::
                      unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                      ::operator[]((unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                                    *)in_stack_fffffffffffff450,
                                   (key_type *)in_stack_fffffffffffff448);
            bVar4 = LinePosition::operator==(&pmVar15->begin,&pmVar16->end);
            if (!bVar4) {
              pmVar15 = ::std::
                        unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                        ::operator[]((unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                                      *)in_stack_fffffffffffff450,
                                     (key_type *)in_stack_fffffffffffff448);
              local_450 = (Vector *)
                          LinePosition::GetGlobalPosition
                                    (&pmVar15->begin,in_RDI[0x22],(bool)(local_229 & 1));
            }
            shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                      ((shared_ptr<duckdb::CSVStateMachine,_true> *)in_stack_fffffffffffff450);
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)in_stack_fffffffffffff450,(size_type)in_stack_fffffffffffff448);
            in_stack_fffffffffffff458 = local_450;
            local_4f8 = (DataChunk *)local_228[0].boundary_idx;
            pCStack_4f0 = (CSVReaderOptions *)local_228[0].lines_in_batch;
            local_500 = (StringValueResult *)optional_idx::Invalid();
            this_00 = Vector::GetType(local_88);
            LVar5 = LogicalType::id(this_00);
            in_stack_fffffffffffff470 = (LogicalType *)(in_RDI + 0x8c);
            in_stack_fffffffffffff468 = (uint)LVar5;
            in_stack_fffffffffffff448 = local_4f8;
            in_stack_fffffffffffff450 = pCStack_4f0;
            in_stack_fffffffffffff460 = local_500;
            CSVError::CastError(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                                in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                                in_stack_fffffffffffff8d0,in_stack_fffffffffffff910,
                                in_stack_fffffffffffff920,in_stack_fffffffffffff8f8,
                                in_stack_fffffffffffff930,in_stack_fffffffffffff938);
            in_stack_fffffffffffff598 =
                 shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                           ((shared_ptr<duckdb::CSVErrorHandler,_true> *)in_stack_fffffffffffff450);
            CSVErrorHandler::Error
                      ((CSVErrorHandler *)in_stack_fffffffffffff490,
                       (CSVError *)in_stack_fffffffffffff488,
                       SUB81((ulong)in_stack_fffffffffffff480._M_cur >> 0x38,0));
            CSVError::~CSVError((CSVError *)in_stack_fffffffffffff450);
            ::std::__cxx11::string::~string(local_448);
            ::std::__cxx11::ostringstream::~ostringstream(local_3c8);
            ::std::__cxx11::string::~string(local_250);
          }
          local_508 = local_120;
          local_120 = local_120 + 1;
          pVar18 = ::std::
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)in_stack_fffffffffffff460,(value_type *)in_stack_fffffffffffff458);
          in_stack_fffffffffffff590._M_cur =
               (__node_type *)pVar18.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
          in_stack_fffffffffffff58f = pVar18.second;
          local_518._M_cur = in_stack_fffffffffffff590._M_cur;
          local_510 = in_stack_fffffffffffff58f;
          for (; uVar2 = local_120, in_stack_fffffffffffff580 = DataChunk::size(local_28),
              uVar2 < in_stack_fffffffffffff580; local_120 = local_120 + 1) {
            bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                              ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffff458,
                               (idx_t)in_stack_fffffffffffff450);
            if ((!bVar4) &&
               (bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                                  ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffff458
                                   ,(idx_t)in_stack_fffffffffffff450), bVar4)) {
              pVar18 = ::std::
                       unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                       ::insert((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                 *)in_stack_fffffffffffff460,(value_type *)in_stack_fffffffffffff458
                               );
              local_528._M_cur =
                   (__node_type *)
                   pVar18.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
              local_520 = pVar18.second;
              vector<duckdb::Value,_true>::vector((vector<duckdb::Value,_true> *)0x1ae3afb);
              local_548 = 0;
              while( true ) {
                uVar2 = local_548;
                iVar6 = DataChunk::ColumnCount((DataChunk *)0x1ae3b24);
                uVar20 = (undefined1)(in_stack_fffffffffffff580 >> 0x38);
                if (iVar6 <= uVar2) break;
                DataChunk::GetValue((DataChunk *)
                                    CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468),
                                    (idx_t)in_stack_fffffffffffff460,
                                    (idx_t)in_stack_fffffffffffff458);
                ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                          ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)
                           in_stack_fffffffffffff450,(value_type *)in_stack_fffffffffffff448);
                Value::~Value((Value *)in_stack_fffffffffffff450);
                local_548 = local_548 + 1;
              }
              shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                        ((shared_ptr<duckdb::CSVStateMachine,_true> *)in_stack_fffffffffffff450);
              bVar4 = CSVReaderOptions::IgnoreErrors(in_stack_fffffffffffff450);
              if (!bVar4) {
                iVar6 = CSVIterator::GetBoundaryIdx((CSVIterator *)(in_RDI + 0xb));
                lVar1 = in_RDI[0x18];
                iVar13 = DataChunk::size(local_28);
                LinesPerBoundary::LinesPerBoundary(local_598,iVar6,(lVar1 - iVar13) + local_120);
                in_stack_fffffffffffff520 =
                     (Vector *)
                     ::std::
                     unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                     ::operator[]((unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                                   *)in_stack_fffffffffffff450,(key_type *)in_stack_fffffffffffff448
                                 );
                in_stack_fffffffffffff510 = (UnifiedVectorFormat *)(in_RDI + 0x59);
                in_stack_fffffffffffff51f =
                     StringValueResult::PrintErrorLine(in_stack_fffffffffffff460);
                FullLinePosition::
                ReconstructCurrentLine<std::unordered_map<unsigned_long,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,duckdb::shared_ptr<duckdb::CSVBufferHandle,true>>>>>
                          ((FullLinePosition *)in_stack_fffffffffffff598,
                           (bool *)in_stack_fffffffffffff590._M_cur,
                           (unordered_map<unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::shared_ptr<duckdb::CSVBufferHandle,_true>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffff58f,in_stack_fffffffffffff588),
                           (bool)uVar20);
                ::std::__cxx11::ostringstream::ostringstream(local_738);
                ::std::operator<<((ostream *)local_738,"Could not convert string \"");
                Vector::GetValue(in_stack_fffffffffffff458,(idx_t)in_stack_fffffffffffff450);
                in_stack_fffffffffffff500 =
                     (Vector *)
                     duckdb::operator<<((ostream *)in_stack_fffffffffffff490,
                                        (Value *)in_stack_fffffffffffff488);
                in_stack_fffffffffffff4f8 =
                     (Vector *)::std::operator<<((ostream *)in_stack_fffffffffffff500,"\" to \'");
                in_stack_fffffffffffff4f7 = LogicalType::id(local_90);
                LogicalTypeIdToString_abi_cxx11_
                          ((LogicalTypeId)((ulong)in_stack_fffffffffffff448 >> 0x38));
                poVar14 = ::std::operator<<((ostream *)in_stack_fffffffffffff4f8,local_798);
                ::std::operator<<(poVar14,"\'");
                ::std::__cxx11::string::~string(local_798);
                Value::~Value((Value *)in_stack_fffffffffffff450);
                ::std::__cxx11::ostringstream::str();
                FullLinePosition::SanitizeError
                          ((string *)CONCAT17(in_stack_fffffffffffff4f7,in_stack_fffffffffffff4f0));
                shared_ptr<duckdb::CSVStateMachine,_true>::operator->
                          ((shared_ptr<duckdb::CSVStateMachine,_true> *)in_stack_fffffffffffff450);
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              *)in_stack_fffffffffffff450,(size_type)in_stack_fffffffffffff448);
                local_858 = (DataChunk *)local_598[0].boundary_idx;
                pCStack_850 = (CSVReaderOptions *)local_598[0].lines_in_batch;
                in_stack_fffffffffffff4c0 = local_38;
                pmVar15 = ::std::
                          unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                          ::operator[]((unordered_map<unsigned_long,_duckdb::FullLinePosition,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::FullLinePosition>_>_>
                                        *)in_stack_fffffffffffff450,
                                       (key_type *)in_stack_fffffffffffff448);
                in_stack_fffffffffffff458 =
                     (Vector *)LinePosition::GetGlobalPosition(&pmVar15->begin,in_RDI[0x22],false);
                in_stack_fffffffffffff4b0 = optional_idx::Invalid();
                local_860 = (StringValueResult *)in_stack_fffffffffffff4b0;
                in_stack_fffffffffffff4a8 = (Vector *)Vector::GetType(local_88);
                in_stack_fffffffffffff4a7 =
                     LogicalType::id((LogicalType *)in_stack_fffffffffffff4a8);
                in_stack_fffffffffffff470 = (LogicalType *)(in_RDI + 0x8c);
                in_stack_fffffffffffff468 = (uint)in_stack_fffffffffffff4a7;
                in_stack_fffffffffffff448 = local_858;
                in_stack_fffffffffffff450 = pCStack_850;
                in_stack_fffffffffffff460 = local_860;
                in_stack_fffffffffffff4b8 = in_stack_fffffffffffff458;
                CSVError::CastError(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                                    in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                                    in_stack_fffffffffffff8d0,in_stack_fffffffffffff910,
                                    in_stack_fffffffffffff920,in_stack_fffffffffffff8f8,
                                    in_stack_fffffffffffff930,in_stack_fffffffffffff938);
                in_stack_fffffffffffff498 =
                     shared_ptr<duckdb::CSVErrorHandler,_true>::operator->
                               ((shared_ptr<duckdb::CSVErrorHandler,_true> *)
                                in_stack_fffffffffffff450);
                CSVErrorHandler::Error
                          ((CSVErrorHandler *)in_stack_fffffffffffff490,
                           (CSVError *)in_stack_fffffffffffff488,
                           SUB81((ulong)in_stack_fffffffffffff480._M_cur >> 0x38,0));
                CSVError::~CSVError((CSVError *)in_stack_fffffffffffff450);
                ::std::__cxx11::string::~string(local_7b8);
                ::std::__cxx11::ostringstream::~ostringstream(local_738);
                ::std::__cxx11::string::~string(local_5c0);
              }
              vector<duckdb::Value,_true>::~vector((vector<duckdb::Value,_true> *)0x1ae412d);
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat
                    ((UnifiedVectorFormat *)in_stack_fffffffffffff450);
          UnifiedVectorFormat::~UnifiedVectorFormat
                    ((UnifiedVectorFormat *)in_stack_fffffffffffff450);
          local_124 = 0;
        }
        ::std::__cxx11::string::~string(local_118);
      }
      else {
        Vector::Reinterpret(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
      }
      local_38 = (DataChunk *)
                 ((long)&(local_38->data).
                         super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl
                         .super__Vector_impl_data._M_start + 1);
    }
    bVar4 = ::std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::empty((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)0x1ae41fe);
    if (!bVar4) {
      DataChunk::size(local_28);
      SelectionVector::SelectionVector
                ((SelectionVector *)in_stack_fffffffffffff470,
                 CONCAT44(in_stack_fffffffffffff46c,in_stack_fffffffffffff468));
      local_880 = 0;
      local_888 = (StringValueResult *)0x0;
      while (in_stack_fffffffffffff488 = local_888,
            in_stack_fffffffffffff490 = (StringValueResult *)DataChunk::size(local_28),
            in_stack_fffffffffffff488 < in_stack_fffffffffffff490) {
        in_stack_fffffffffffff480._M_cur =
             (__node_type *)
             ::std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::find((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                     *)in_stack_fffffffffffff448,(key_type *)0x1ae428b);
        local_890._M_cur = in_stack_fffffffffffff480._M_cur;
        local_898._M_cur =
             (__node_type *)
             ::std::
             unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
             ::end((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *)in_stack_fffffffffffff448);
        bVar4 = ::std::__detail::operator==(&local_890,&local_898);
        if (bVar4) {
          local_880 = local_880 + 1;
          SelectionVector::set_index
                    ((SelectionVector *)in_stack_fffffffffffff460,(idx_t)in_stack_fffffffffffff458,
                     (idx_t)in_stack_fffffffffffff450);
        }
        local_888 = (StringValueResult *)&(local_888->super_ScannerResult).unquoted;
      }
      DataChunk::Slice(in_stack_fffffffffffff4c0,(SelectionVector *)in_stack_fffffffffffff4b8,
                       in_stack_fffffffffffff4b0.index);
      ::std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::clear((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
               *)0x1ae4387);
      SelectionVector::~SelectionVector((SelectionVector *)0x1ae4394);
    }
    iVar6 = DataChunk::size(local_10);
    if ((iVar6 == 0) &&
       (bVar4 = duckdb::shared_ptr::operator_cast_to_bool
                          ((shared_ptr<duckdb::CSVBufferHandle,_true> *)0x1ae43bf), bVar4)) {
      bVar4 = CSVIterator::IsBoundarySet((CSVIterator *)(in_RDI + 0xb));
      if (bVar4) {
        local_8a0 = CSVIterator::GetEndPos((CSVIterator *)(in_RDI + 0xb));
        pCVar17 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                            ((shared_ptr<duckdb::CSVBufferHandle,_true> *)in_stack_fffffffffffff450)
        ;
        if (pCVar17->actual_size < local_8a0) {
          pCVar17 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                              ((shared_ptr<duckdb::CSVBufferHandle,_true> *)
                               in_stack_fffffffffffff450);
          local_8a0 = pCVar17->actual_size;
        }
      }
      else {
        pCVar17 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->
                            ((shared_ptr<duckdb::CSVBufferHandle,_true> *)in_stack_fffffffffffff450)
        ;
        local_8a0 = pCVar17->actual_size;
      }
      if ((ulong)in_RDI[0xc] < local_8a0) {
        local_11 = 1;
      }
    }
  } while ((local_11 & 1) != 0);
  return;
}

Assistant:

void StringValueScanner::Flush(DataChunk &insert_chunk) {
	bool continue_processing;
	do {
		continue_processing = false;
		auto &process_result = ParseChunk();
		// First Get Parsed Chunk
		auto &parse_chunk = process_result.ToChunk();
		insert_chunk.Reset();
		// We have to check if we got to error
		error_handler->ErrorIfNeeded();
		if (parse_chunk.size() == 0) {
			return;
		}
		// convert the columns in the parsed chunk to the types of the table
		insert_chunk.SetCardinality(parse_chunk);

		// We keep track of the borked lines, in case we are ignoring errors
		D_ASSERT(csv_file_scan);

		auto &names = csv_file_scan->GetNames();
		// Now Do the cast-aroo
		for (idx_t i = 0; i < csv_file_scan->column_ids.size(); i++) {
			idx_t result_idx = i;
			if (!csv_file_scan->projection_ids.empty()) {
				result_idx = csv_file_scan->projection_ids[i].second;
			}
			if (i >= parse_chunk.ColumnCount()) {
				throw InvalidInputException("Mismatch between the schema of different files");
			}
			auto &parse_vector = parse_chunk.data[i];
			auto &result_vector = insert_chunk.data[result_idx];
			auto &type = result_vector.GetType();
			auto &parse_type = parse_vector.GetType();
			if (!type.IsJSONType() && (type == LogicalType::VARCHAR ||
			                           (type != LogicalType::VARCHAR && parse_type != LogicalType::VARCHAR))) {
				// reinterpret rather than reference
				result_vector.Reinterpret(parse_vector);
			} else {
				string error_message;
				idx_t line_error = 0;
				if (VectorOperations::TryCast(buffer_manager->context, parse_vector, result_vector, parse_chunk.size(),
				                              &error_message, false, true)) {
					continue;
				}
				// An error happened, to propagate it we need to figure out the exact line where the casting failed.
				UnifiedVectorFormat inserted_column_data;
				result_vector.ToUnifiedFormat(parse_chunk.size(), inserted_column_data);
				UnifiedVectorFormat parse_column_data;
				parse_vector.ToUnifiedFormat(parse_chunk.size(), parse_column_data);

				for (; line_error < parse_chunk.size(); line_error++) {
					if (!inserted_column_data.validity.RowIsValid(line_error) &&
					    parse_column_data.validity.RowIsValid(line_error)) {
						break;
					}
				}
				{
					if (state_machine->options.ignore_errors.GetValue()) {
						vector<Value> row;
						for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
							row.push_back(parse_chunk.GetValue(col, line_error));
						}
					}
					if (!state_machine->options.IgnoreErrors()) {
						LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(),
						                                 lines_read - parse_chunk.size() + line_error);
						bool first_nl = false;
						auto borked_line = result.line_positions_per_row[line_error].ReconstructCurrentLine(
						    first_nl, result.buffer_handles, result.PrintErrorLine());
						std::ostringstream error;
						error << "Could not convert string \"" << parse_vector.GetValue(line_error) << "\" to \'"
						      << type.ToString() << "\'";
						string error_msg = error.str();
						FullLinePosition::SanitizeError(error_msg);
						idx_t row_byte_pos = 0;
						if (!(result.line_positions_per_row[line_error].begin ==
						      result.line_positions_per_row[line_error].end)) {
							row_byte_pos = result.line_positions_per_row[line_error].begin.GetGlobalPosition(
							    result.result_size, first_nl);
						}
						auto csv_error = CSVError::CastError(
						    state_machine->options, names[i], error_msg, i, borked_line, lines_per_batch, row_byte_pos,
						    optional_idx::Invalid(), result_vector.GetType().id(), result.path);
						error_handler->Error(csv_error);
					}
				}
				result.borked_rows.insert(line_error++);
				D_ASSERT(state_machine->options.ignore_errors.GetValue());
				// We are ignoring errors. We must continue but ignoring borked-rows
				for (; line_error < parse_chunk.size(); line_error++) {
					if (!inserted_column_data.validity.RowIsValid(line_error) &&
					    parse_column_data.validity.RowIsValid(line_error)) {
						result.borked_rows.insert(line_error);
						vector<Value> row;
						for (idx_t col = 0; col < parse_chunk.ColumnCount(); col++) {
							row.push_back(parse_chunk.GetValue(col, line_error));
						}
						if (!state_machine->options.IgnoreErrors()) {
							LinesPerBoundary lines_per_batch(iterator.GetBoundaryIdx(),
							                                 lines_read - parse_chunk.size() + line_error);
							bool first_nl = false;
							auto borked_line = result.line_positions_per_row[line_error].ReconstructCurrentLine(
							    first_nl, result.buffer_handles, result.PrintErrorLine());
							std::ostringstream error;
							// Casting Error Message
							error << "Could not convert string \"" << parse_vector.GetValue(line_error) << "\" to \'"
							      << LogicalTypeIdToString(type.id()) << "\'";
							string error_msg = error.str();
							FullLinePosition::SanitizeError(error_msg);
							auto csv_error = CSVError::CastError(
							    state_machine->options, names[i], error_msg, i, borked_line, lines_per_batch,
							    result.line_positions_per_row[line_error].begin.GetGlobalPosition(result.result_size,
							                                                                      first_nl),
							    optional_idx::Invalid(), result_vector.GetType().id(), result.path);
							error_handler->Error(csv_error);
						}
					}
				}
			}
		}
		if (!result.borked_rows.empty()) {
			// We must remove the borked lines from our chunk
			SelectionVector successful_rows(parse_chunk.size());
			idx_t sel_idx = 0;
			for (idx_t row_idx = 0; row_idx < parse_chunk.size(); row_idx++) {
				if (result.borked_rows.find(row_idx) == result.borked_rows.end()) {
					successful_rows.set_index(sel_idx++, row_idx);
				}
			}
			// Now we slice the result
			insert_chunk.Slice(successful_rows, sel_idx);
			result.borked_rows.clear();
		}
		if (insert_chunk.size() == 0 && cur_buffer_handle) {
			idx_t to_pos;
			if (iterator.IsBoundarySet()) {
				to_pos = iterator.GetEndPos();
				if (to_pos > cur_buffer_handle->actual_size) {
					to_pos = cur_buffer_handle->actual_size;
				}
			} else {
				to_pos = cur_buffer_handle->actual_size;
			}
			if (iterator.pos.buffer_pos < to_pos) {
				// If a chunk is complete with errors, we might get to this situation where we must proceed with the
				// scanning
				continue_processing = true;
			}
		}
	} while (continue_processing);
}